

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetNoStream(cmUVProcessChainBuilder *this,Stream stdio)

{
  if (stdio < (Stream_ERROR|Stream_OUTPUT)) {
    (this->Stdio)._M_elems[stdio].Type = None;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetNoStream(Stream stdio)
{
  switch (stdio) {
    case Stream_INPUT:
    case Stream_OUTPUT:
    case Stream_ERROR: {
      auto& streamData = this->Stdio[stdio];
      streamData.Type = None;
      break;
    }
  }
  return *this;
}